

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::getDeviceMajorMinorVersion
          (CLIntercept *this,cl_device_id device,size_t *majorVersion,size_t *minorVersion)

{
  cl_int cVar1;
  char *in_RCX;
  char **in_RDX;
  CLIntercept *in_RSI;
  cl_device_id in_RDI;
  CLIntercept *unaff_retaddr;
  cl_int errorCode;
  char *deviceVersion;
  uint in_stack_ffffffffffffffd0;
  size_t *major;
  
  major = (size_t *)0x0;
  cVar1 = allocateAndGetDeviceInfoString
                    (unaff_retaddr,in_RDI,(cl_device_info)((ulong)in_RSI >> 0x20),in_RDX);
  if ((cVar1 == 0) && (major != (size_t *)0x0)) {
    getMajorMinorVersionFromString
              (in_RSI,(char *)in_RDX,in_RCX,major,(size_t *)(ulong)in_stack_ffffffffffffffd0);
  }
  if (major != (size_t *)0x0) {
    operator_delete__(major);
  }
  return cVar1;
}

Assistant:

cl_int CLIntercept::getDeviceMajorMinorVersion(
    cl_device_id device,
    size_t& majorVersion,
    size_t& minorVersion ) const
{
    char*   deviceVersion = NULL;

    cl_int  errorCode = allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VERSION,
        deviceVersion );
    if( errorCode == CL_SUCCESS && deviceVersion )
    {
        // According to the spec, the device version string should have the form:
        //   OpenCL <Major>.<Minor> <Vendor Specific Info>
        getMajorMinorVersionFromString(
            "OpenCL ",
            deviceVersion,
            majorVersion,
            minorVersion );
    }

    delete [] deviceVersion;
    deviceVersion = NULL;

    return errorCode;
}